

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluPixelTransfer.cpp
# Opt level: O1

void glu::readPixels(RenderContext *context,int x,int y,PixelBufferAccess *dst)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  TransferFormat TVar7;
  InternalError *this;
  uint uVar8;
  uint uVar9;
  TextureFormat local_38;
  
  iVar4 = (*context->_vptr_RenderContext[3])();
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] == 1) {
    iVar1 = (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1];
    iVar5 = tcu::TextureFormat::getPixelSize((TextureFormat *)dst);
    iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
    if (iVar1 == iVar5 * iVar2) {
      iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
      TVar7 = getTransferFormat((dst->super_ConstPixelBufferAccess).m_format);
      pcVar3 = *(code **)(CONCAT44(extraout_var,iVar4) + 0xff0);
      local_38 = (dst->super_ConstPixelBufferAccess).m_format;
      uVar6 = tcu::TextureFormat::getPixelSize(&local_38);
      uVar8 = 8;
      if ((int)uVar6 < 8) {
        uVar8 = uVar6;
      }
      uVar9 = 1;
      if ((uVar6 & uVar6 - 1) == 0) {
        uVar9 = uVar8;
      }
      (*pcVar3)(0xd05,uVar9);
      (**(code **)(CONCAT44(extraout_var,iVar4) + 0x1220))
                (x,y,iVar2,iVar1,(ulong)TVar7 & 0xffffffff,(ulong)TVar7 >> 0x20,
                 (dst->super_ConstPixelBufferAccess).m_data);
      return;
    }
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,(char *)0x0,"dst.getRowPitch() == dst.getFormat().getPixelSize()*dst.getWidth()"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
               ,0x36);
  }
  else {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,(char *)0x0,"dst.getDepth() == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
               ,0x35);
  }
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void readPixels (const RenderContext& context, int x, int y, const tcu::PixelBufferAccess& dst)
{
	const glw::Functions& gl = context.getFunctions();

	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	TCU_CHECK_INTERNAL(dst.getRowPitch() == dst.getFormat().getPixelSize()*dst.getWidth());

	int				width		= dst.getWidth();
	int				height		= dst.getHeight();
	TransferFormat	format		= getTransferFormat(dst.getFormat());

	gl.pixelStorei(GL_PACK_ALIGNMENT, getTransferAlignment(dst.getFormat()));
	gl.readPixels(x, y, width, height, format.format, format.dataType, dst.getDataPtr());
}